

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

void __thiscall
ws::Record::Record(Record *this,time_point time_point_,Severity severity_,source_location location_)

{
  size_t sVar1;
  hash<std::thread::id> local_19;
  id local_18;
  
  (this->time_point).__d.__r = (rep)time_point_.__d.__r;
  this->severity = severity_;
  local_18._M_thread = pthread_self();
  sVar1 = std::hash<std::thread::id>::operator()(&local_19,&local_18);
  this->thread_id = sVar1;
  (this->location)._M_impl = location_._M_impl;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  (this->message)._M_string_length = 0;
  (this->message).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Record(std::chrono::system_clock::time_point time_point_, Severity severity_,
           std::source_location location_)
        : time_point(time_point_), severity(severity_), location(location_),
          thread_id(std::hash<std::thread::id>{}(std::this_thread::get_id()))
    {
    }